

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

BigIndex * __thiscall Js::JavascriptArray::BigIndex::operator++(BigIndex *this)

{
  bool bVar1;
  BigIndex *this_local;
  
  bVar1 = IsSmallIndex(this);
  if (bVar1) {
    this->index = this->index + 1;
  }
  else {
    this->bigIndex = this->bigIndex + 1;
  }
  return this;
}

Assistant:

const JavascriptArray::BigIndex& JavascriptArray::BigIndex::operator++()
    {
        if (IsSmallIndex())
        {
            ++index;
            // If index reaches InvalidIndex, we will start to use bigIndex which is initially InvalidIndex.
        }
        else
        {
            bigIndex = bigIndex + 1;
        }

        return *this;
    }